

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleRealPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  string *__u;
  value_type *this;
  bool bVar3;
  string_view name;
  string_view name_00;
  string_view value;
  cmCMakePath path;
  _Any_data local_168;
  _Manager_type local_158;
  pointer ppStack_150;
  pointer local_148;
  pointer ppStack_140;
  string realPath;
  value_type input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  path local_d0;
  Arguments arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this = (value_type *)&path;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"REAL_PATH requires a path and an output variable",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&path);
    return false;
  }
  if (((anonymous_namespace)::
       HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar2 != 0)) {
    local_148 = (pointer)0x0;
    ppStack_140 = (pointer)0x0;
    local_158 = (_Manager_type)0x0;
    ppStack_150 = (pointer)0x0;
    local_168._M_unused._M_object = (void *)0x0;
    local_168._8_8_ = (_Manager_type)0x0;
    path.Path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0;
    path.Path._M_pathname.field_2._M_allocated_capacity = 0;
    path.Path._M_pathname.field_2._8_8_ = 0;
    path.Path._M_pathname._M_dataplus._M_p = (pointer)0x0;
    path.Path._M_pathname._M_string_length = 0;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x30;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_manager;
    name._M_str = "BASE_DIRECTORY";
    name._M_len = 0xe;
    ArgumentParser::Base::Bind((Base *)&path,name,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x58;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_manager;
    name_00._M_str = "EXPAND_TILDE";
    name_00._M_len = 0xc;
    ArgumentParser::Base::Bind((Base *)&path,name_00,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleRealPathCommand::parser,(ActionMap *)&path);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&path);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleRealPathCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  path.Path._M_pathname.field_2._M_allocated_capacity = (size_type)&unparsedArguments;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  realPath._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  realPath._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3);
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.ExpandTilde = false;
  path.Path._M_pathname._M_dataplus._M_p = (pointer)&HandleRealPathCommand::parser;
  path.Path._M_pathname._M_string_length = (size_type)&arguments;
  path.Path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = (_Manager_type)0x0;
  local_158 = (_Manager_type)0x0;
  ppStack_150 = (pointer)0x0;
  local_148 = (pointer)((ulong)local_148 & 0xffffffffffffff00);
  path.Path._M_pathname.field_2._8_8_ = path.Path._M_pathname._M_string_length;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&path,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&realPath,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  bVar3 = unparsedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          unparsedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar3) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError
                      (&arguments.super_ParseResult,status->Makefile);
    if (bVar1) goto LAB_002dc15f;
    if (arguments.BaseDirectory.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      __u = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&arguments.BaseDirectory,__u);
    }
    std::__cxx11::string::string
              ((string *)&input,
               (string *)
               ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    if ((((arguments.ExpandTilde == true) && (input._M_string_length != 0)) &&
        (*input._M_dataplus._M_p == '~')) &&
       ((input._M_string_length == 1 || (input._M_dataplus._M_p[1] == '/')))) {
      path.Path._M_pathname._M_dataplus._M_p = (pointer)&path.Path._M_pathname.field_2;
      path.Path._M_pathname._M_string_length = 0;
      path.Path._M_pathname.field_2._M_allocated_capacity =
           path.Path._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar1 = cmsys::SystemTools::GetEnv("HOME",(string *)&path);
      if (bVar1) {
        std::__cxx11::string::replace((ulong)&input,0,(string *)&DAT_00000001);
      }
      std::__cxx11::string::~string((string *)&path);
    }
    std::__cxx11::string::string((string *)&local_48,(string *)&input);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&path,&local_48,auto_format);
    std::__cxx11::string::~string((string *)&local_48);
    cmCMakePath::Absolute<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_d0,&path,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &arguments.BaseDirectory);
    cmCMakePath::Normal((cmCMakePath *)&realPath,(cmCMakePath *)&local_d0);
    cmCMakePath::operator=(&path,(cmCMakePath *)&realPath);
    std::filesystem::__cxx11::path::~path((path *)&realPath);
    std::filesystem::__cxx11::path::~path(&local_d0);
    std::filesystem::__cxx11::path::generic_string(&local_d0._M_pathname,&path.Path);
    cmsys::SystemTools::GetRealPath(&realPath,&local_d0._M_pathname,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_d0);
    value._M_str = realPath._M_dataplus._M_p;
    value._M_len = realPath._M_string_length;
    cmMakefile::AddDefinition
              (status->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,value);
    std::__cxx11::string::~string((string *)&realPath);
    std::filesystem::__cxx11::path::~path(&path.Path);
    this = &input;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"REAL_PATH called with unexpected arguments",
               (allocator<char> *)&realPath);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)this);
LAB_002dc15f:
  HandleRealPathCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar3;
}

Assistant:

bool HandleRealPathCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("REAL_PATH requires a path and an output variable");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> BaseDirectory;
    bool ExpandTilde = false;
  };
  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("BASE_DIRECTORY"_s, &Arguments::BaseDirectory)
      .Bind("EXPAND_TILDE"_s, &Arguments::ExpandTilde);

  std::vector<std::string> unparsedArguments;
  auto arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unparsedArguments);

  if (!unparsedArguments.empty()) {
    status.SetError("REAL_PATH called with unexpected arguments");
    return false;
  }
  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!arguments.BaseDirectory) {
    arguments.BaseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  auto input = args[1];
  if (arguments.ExpandTilde && !input.empty()) {
    if (input[0] == '~' && (input.length() == 1 || input[1] == '/')) {
      std::string home;
      if (
#if defined(_WIN32) && !defined(__CYGWIN__)
        cmSystemTools::GetEnv("USERPROFILE", home) ||
#endif
        cmSystemTools::GetEnv("HOME", home)) {
        input.replace(0, 1, home);
      }
    }
  }

  cmCMakePath path(input, cmCMakePath::auto_format);
  path = path.Absolute(*arguments.BaseDirectory).Normal();
  auto realPath = cmSystemTools::GetRealPath(path.GenericString());

  status.GetMakefile().AddDefinition(args[2], realPath);

  return true;
}